

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_info_manager.cpp
# Opt level: O0

uint32_t spvtools::opt::analysis::AddNewConstInGlobals(IRContext *context,uint32_t const_value)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<spvtools::opt::Operand> __l;
  uint32_t uVar1;
  uint32_t ty_id;
  Instruction *this;
  TypeManager *this_00;
  Module *this_01;
  Operand *local_c8;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_c0;
  allocator<spvtools::opt::Operand> local_b5;
  uint32_t local_b4;
  iterator local_b0;
  undefined8 local_a8;
  SmallVector<unsigned_int,_2UL> local_a0;
  Operand local_78;
  iterator local_48;
  _func_int **local_40;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_38;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_20;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> new_const
  ;
  uint32_t id;
  uint32_t const_value_local;
  IRContext *context_local;
  
  new_const._M_t.
  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_ = const_value;
  new_const._M_t.
  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._0_4_ =
       IRContext::TakeNextId(context);
  this = (Instruction *)::operator_new(0x70);
  this_00 = IRContext::get_type_mgr(context);
  ty_id = TypeManager::GetUIntTypeId(this_00);
  uVar1 = (uint32_t)
          new_const._M_t.
          super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
          ._M_t.
          super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
          .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  local_b4 = new_const._M_t.
             super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
             .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_;
  local_b0 = &local_b4;
  local_a8 = 1;
  init_list._M_len = 1;
  init_list._M_array = local_b0;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_a0,init_list);
  Operand::Operand(&local_78,SPV_OPERAND_TYPE_TYPED_LITERAL_NUMBER,&local_a0);
  local_48 = &local_78;
  local_40 = (_func_int **)0x1;
  std::allocator<spvtools::opt::Operand>::allocator(&local_b5);
  __l._M_len = (size_type)local_40;
  __l._M_array = local_48;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
            (&local_38,__l,&local_b5);
  opt::Instruction::Instruction(this,context,OpConstant,ty_id,uVar1,&local_38);
  std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
  unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
            ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
              *)&local_20,this);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_38);
  std::allocator<spvtools::opt::Operand>::~allocator(&local_b5);
  local_c8 = (Operand *)&local_48;
  do {
    local_c8 = local_c8 + -1;
    Operand::~Operand(local_c8);
  } while (local_c8 != &local_78);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_a0);
  this_01 = IRContext::module(context);
  std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
  unique_ptr(&local_c0,&local_20);
  Module::AddGlobalValue(this_01,&local_c0);
  std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
  ~unique_ptr(&local_c0);
  IRContext::InvalidateAnalyses(context,kAnalysisConstants);
  IRContext::InvalidateAnalyses(context,kAnalysisBegin);
  uVar1 = (uint32_t)
          new_const._M_t.
          super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
          ._M_t.
          super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
          .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
  ~unique_ptr(&local_20);
  return uVar1;
}

Assistant:

uint32_t AddNewConstInGlobals(IRContext* context, uint32_t const_value) {
  uint32_t id = context->TakeNextId();
  std::unique_ptr<Instruction> new_const(new Instruction(
      context, spv::Op::OpConstant, context->get_type_mgr()->GetUIntTypeId(),
      id,
      {
          {spv_operand_type_t::SPV_OPERAND_TYPE_TYPED_LITERAL_NUMBER,
           {const_value}},
      }));
  context->module()->AddGlobalValue(std::move(new_const));
  context->InvalidateAnalyses(IRContext::kAnalysisConstants);
  context->InvalidateAnalyses(IRContext::kAnalysisDefUse);
  return id;
}